

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecRecursively
          (Impl *this,int parent,int current,PrimSpec *parentPrimSpec,int level,
          PathIndexToSpecIndexMap *psmap,Layer *layer)

{
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  storage_t<tinyusdz::PrimSpec> *rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pNVar2;
  pointer pcVar3;
  uint __val;
  Type TVar4;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *this_01;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *this_02;
  char cVar5;
  bool bVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  long lVar9;
  pointer puVar10;
  _Base_ptr p_Var11;
  size_type sVar12;
  mapped_type *pmVar13;
  long *plVar14;
  undefined8 *puVar15;
  mapped_type *this_03;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  size_type sVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  uint uVar23;
  size_type *psVar24;
  ulong uVar25;
  size_type *psVar26;
  undefined1 *puVar27;
  _Base_ptr p_Var28;
  _Rb_tree_header *p_Var29;
  Impl *this_04;
  char cVar30;
  char *pcVar31;
  undefined8 uVar32;
  uint uVar33;
  ulong uVar34;
  pointer piVar35;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  PrimSpec *parentPrimSpec_00;
  int current_local;
  _Rb_tree_header *local_d58;
  Impl *local_d50;
  int parent_local;
  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  *local_d40;
  PrimSpec *local_d38;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  string variantSetName;
  string __str;
  string __str_1;
  key_type_conflict2 *local_c90;
  map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  *local_c88;
  string prop_name;
  long local_c60 [10];
  ios_base local_c10 [264];
  PrimSpec variant;
  optional<tinyusdz::PrimSpec> primspec;
  
  current_local = current;
  parent_local = parent;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,"ReconstructPrimSpecRecursively",0x1e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<(&primspec,0xdd0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&primspec,"PrimSpec hierarchy is too deep.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"\n",1);
    goto LAB_0018e092;
  }
  if ((-1 < current) &&
     (current < (int)((ulong)((long)(this->_nodes).
                                    super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_nodes).
                                   super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x41041041))
  {
    primspec.has_value_ = false;
    local_d38 = parentPrimSpec;
    memset(&primspec.contained,0,0x568);
    p_Var11 = (this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_d58 = &(this->_variantPrims)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &local_d58->_M_header;
    p_Var28 = &local_d58->_M_header;
    if (p_Var11 != (_Base_ptr)0x0) {
      do {
        if (parent <= (int)p_Var11[1]._M_color) {
          p_Var8 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < parent];
      } while (p_Var11 != (_Base_ptr)0x0);
      p_Var11 = (_Base_ptr)0x0;
      if (((_Rb_tree_header *)p_Var8 != local_d58) &&
         (p_Var28 = p_Var8, parent < (int)p_Var8[1]._M_color)) {
        p_Var28 = &local_d58->_M_header;
      }
    }
    bVar6 = ReconstructPrimSpecNode
                      (this,parent,current,(int)p_Var11,(_Rb_tree_header *)p_Var28 != local_d58,
                       psmap,layer,&primspec);
    if (bVar6) {
      parentPrimSpec_00 = (PrimSpec *)0x0;
      if (primspec.has_value_ != false) {
        parentPrimSpec_00 = (PrimSpec *)&primspec.contained;
      }
      lVar9 = (long)current_local;
      pNVar2 = (this->_nodes).
               super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar10 = pNVar2[lVar9]._children.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_d50 = this;
      if (*(pointer *)
           ((long)&pNVar2[lVar9]._children.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
          puVar10) {
        uVar34 = 0;
        do {
          bVar6 = ReconstructPrimSpecRecursively
                            (local_d50,current_local,(int)puVar10[uVar34],parentPrimSpec_00,
                             level + 1,psmap,layer);
          if (!bVar6) goto LAB_0018f154;
          uVar34 = uVar34 + 1;
          puVar10 = pNVar2[lVar9]._children.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar34 < (ulong)((long)*(pointer *)
                                         ((long)&pNVar2[lVar9]._children.
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl + 8) - (long)puVar10 >> 3));
      }
      this_04 = local_d50;
      p_Var11 = (local_d50->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_0018db58:
        this_04 = local_d50;
        p_Var11 = (local_d50->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        rhs = &primspec.contained;
        if (p_Var11 != (_Base_ptr)0x0) {
          p_Var29 = &(local_d50->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = &p_Var29->_M_header;
          do {
            if (current_local <= (int)p_Var11[1]._M_color) {
              p_Var8 = p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < current_local];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var8 != p_Var29) && ((int)p_Var8[1]._M_color <= current_local))
          {
            if (primspec.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe49);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              pcVar31 = "Internal error: must be Prim.";
              lVar9 = 0x1d;
              goto LAB_0018e802;
            }
            pmVar16 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&local_d50->_variantPrimChildren,&current_local);
            piVar35 = (pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            local_d40 = (map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                         *)(pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
            if ((map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                 *)piVar35 != local_d40) {
              local_c88 = &this_04->_variantPrimSpecs;
              do {
                this_02 = local_c88;
                sVar12 = ::std::
                         map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                         ::count(local_c88,piVar35);
                if (sVar12 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe52);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  pcVar31 = "Internal error: variant Prim children not found.";
                  lVar9 = 0x30;
                  goto LAB_0018e802;
                }
                pmVar13 = ::std::
                          map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                          ::at(this_02,piVar35);
                bVar6 = is_variantElementName(&pmVar13->_name);
                if (!bVar6) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe5b);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "Corrupted Crate. Variant Prim has invalid element_name.",0x37);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  this_04 = local_d50;
                  goto LAB_0018e839;
                }
                lVar9 = 0x10;
                do {
                  puVar27 = (undefined1 *)((long)local_c60 + lVar9 + -0x20);
                  *(undefined1 **)((long)&local_c90 + lVar9) = puVar27;
                  *(undefined8 *)((long)&local_c88 + lVar9) = 0;
                  *puVar27 = 0;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0x50);
                bVar6 = tokenize_variantElement
                                  (&pmVar13->_name,
                                   (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)&prop_name);
                local_d58 = (_Rb_tree_header *)CONCAT71(local_d58._1_7_,bVar6);
                if (bVar6) {
                  variant._0_8_ = &variant._typeName._M_string_length;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&variant,prop_name._M_dataplus._M_p,
                             prop_name._M_dataplus._M_p + prop_name._M_string_length);
                  toks._M_elems[0]._M_dataplus._M_p = (pointer)&toks._M_elems[0].field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&toks,local_c60[0],local_c60[1] + local_c60[0]);
                  if (primspec.has_value_ == false) {
                    __assert_fail("has_value()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                                  ,0x550,
                                  "value_type *nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator->() [T = tinyusdz::PrimSpec]"
                                 );
                  }
                  local_c90 = piVar35;
                  pmVar17 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                                          *)((long)&primspec.contained + 0xc0),(key_type *)&variant)
                  ;
                  if ((pmVar17->name)._M_string_length == 0) {
                    ::std::__cxx11::string::_M_assign((string *)pmVar17);
                  }
                  pmVar18 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                            ::operator[](&pmVar17->variantSet,toks._M_elems);
                  PrimMetas::operator=(&pmVar18->_metas,&pmVar13->_metas);
                  pmVar18 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                            ::operator[](&pmVar17->variantSet,toks._M_elems);
                  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::operator=
                            (&pmVar18->_children,&pmVar13->_children);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  piVar35 = local_c90;
                  if ((size_type *)variant._0_8_ != &variant._typeName._M_string_length) {
                    operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                             ,0x55);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
                  poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe60);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&variant,"Invalid variant element_name.",0x1d);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
                  ::std::__cxx11::stringbuf::str();
                  PushError(local_d50,toks._M_elems);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)toks._M_elems[0]._M_dataplus._M_p != &toks._M_elems[0].field_2) {
                    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
                  ::std::ios_base::~ios_base
                            ((ios_base *)
                             &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                  ;
                }
                lVar9 = -0x40;
                plVar14 = local_c60 + 2;
                do {
                  if (plVar14 != (long *)plVar14[-2]) {
                    operator_delete((long *)plVar14[-2],*plVar14 + 1);
                  }
                  plVar14 = plVar14 + -4;
                  lVar9 = lVar9 + 0x20;
                } while (lVar9 != 0);
                if ((char)local_d58 == '\0') goto LAB_0018e2af;
                piVar35 = piVar35 + 1;
                this_04 = local_d50;
              } while ((map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                        *)piVar35 != local_d40);
            }
          }
        }
        if (parent == 0) {
          bVar6 = true;
          if ((primspec.has_value_ == true) &&
             (this_03 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&layer->_prim_specs,
                                     (key_type *)((long)&primspec.contained + 0x28)),
             this_03 != (mapped_type *)rhs)) {
            PrimSpec::MoveFrom(this_03,(PrimSpec *)rhs);
          }
        }
        else {
          sVar12 = ::std::
                   map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                   ::count(&this_04->_variantPrimSpecs,&parent_local);
          if (sVar12 == 0) {
            bVar6 = true;
            if (local_d38 != (PrimSpec *)0x0 && primspec.has_value_ == true) {
              ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
              emplace_back<tinyusdz::PrimSpec>(&local_d38->_children,(PrimSpec *)rhs);
            }
          }
          else {
            if (primspec.has_value_ == false) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[warn]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
              poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe7c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&variant,"parent is variantPrim, but current is not Prim.",0x2f)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushWarn(this_04,&prop_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
              ::std::ios_base::~ios_base
                        ((ios_base *)
                         &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            }
            else {
              pmVar13 = ::std::
                        map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                        ::at(&this_04->_variantPrimSpecs,&parent_local);
              if (primspec.has_value_ == false) {
                __assert_fail("has_value()",
                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                              ,0x591,
                              "value_type &nonstd::optional_lite::optional<tinyusdz::PrimSpec>::value() [T = tinyusdz::PrimSpec]"
                             );
              }
              ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
              emplace_back<tinyusdz::PrimSpec>(&pmVar13->_children,(PrimSpec *)rhs);
            }
            bVar6 = true;
          }
        }
        goto LAB_0018f15e;
      }
      this_00 = &local_d50->_variantPropChildren;
      p_Var29 = &(local_d50->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var29->_M_header;
      do {
        if (current_local <= (int)p_Var11[1]._M_color) {
          p_Var8 = p_Var11;
        }
        p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < current_local];
      } while (p_Var11 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 == p_Var29) || (current_local < (int)p_Var8[1]._M_color))
      goto LAB_0018db58;
      p_Var11 = (local_d50->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var29 = local_d58;
      if (p_Var11 == (_Base_ptr)0x0) {
LAB_0018e186:
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&variant,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe12);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar31 = "Internal error: variant attribute is not a child of VariantPrim.";
        lVar9 = 0x40;
LAB_0018e227:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,pcVar31,lVar9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_04,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) goto LAB_0018e27e;
      }
      else {
        do {
          if (current_local <= (int)*(size_t *)(p_Var11 + 1)) {
            p_Var29 = (_Rb_tree_header *)p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < current_local];
        } while (p_Var11 != (_Base_ptr)0x0);
        if ((p_Var29 == local_d58) || (current_local < (int)p_Var29->_M_node_count))
        goto LAB_0018e186;
        if (local_d38 == (PrimSpec *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
          poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe16);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar31 = "Internal error: parentPrimSpec should exist.";
          lVar9 = 0x2c;
          goto LAB_0018e227;
        }
        pmVar19 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::at(&local_d50->_variantPrims,&current_local);
        bVar6 = is_variantElementName((string *)&pmVar19->_elementPath);
        if (bVar6) {
          lVar9 = 0x10;
          do {
            puVar27 = (undefined1 *)((long)&toks._M_elems[0]._M_dataplus._M_p + lVar9);
            *(undefined1 **)((long)&local_d40 + lVar9) = puVar27;
            *(undefined8 *)((long)toks._M_elems + lVar9 + -8) = 0;
            *puVar27 = 0;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x50);
          bVar6 = tokenize_variantElement((string *)&pmVar19->_elementPath,&toks);
          if (!bVar6) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&variant,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe25);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&variant,"Invalid variant element_name.",0x1d);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this_04,&prop_name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
              operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
            ::std::ios_base::~ios_base
                      ((ios_base *)
                       &variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
            lVar9 = -0x40;
            paVar36 = &toks._M_elems[1].field_2;
            do {
              plVar14 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(paVar36 + -1))->_M_dataplus)._M_p;
              if (paVar36 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar14) {
                operator_delete(plVar14,paVar36->_M_allocated_capacity + 1);
              }
              paVar36 = paVar36 + -2;
              lVar9 = lVar9 + 0x20;
            } while (lVar9 != 0);
            goto LAB_0018e2af;
          }
          variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&variantSetName,toks._M_elems[0]._M_dataplus._M_p,
                     toks._M_elems[0]._M_dataplus._M_p + toks._M_elems[0]._M_string_length);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&__str,toks._M_elems[1]._M_dataplus._M_p,
                     toks._M_elems[1]._M_dataplus._M_p + toks._M_elems[1]._M_string_length);
          PrimSpec::PrimSpec(&variant);
          pmVar16 = ::std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::at(this_00,&current_local);
          piVar35 = (pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_d58 = (_Rb_tree_header *)
                      (pmVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
          if ((_Rb_tree_header *)piVar35 != local_d58) {
            local_d40 = &this_04->_variantProps;
            do {
              this_01 = local_d40;
              sVar20 = ::std::
                       map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                       ::count(local_d40,piVar35);
              if (sVar20 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&prop_name);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                           ,0x55);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"ReconstructPrimSpecRecursively",0x1e);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,"():",3);
                poVar7 = (ostream *)::std::ostream::operator<<(&prop_name,0xe30);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&prop_name,"Internal error: variant Property not found.",0x2b)
                ;
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&prop_name,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushError(this_04,&__str_1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                  operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1
                                 );
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prop_name);
                ::std::ios_base::~ios_base(local_c10);
                bVar6 = false;
                goto LAB_0018f0c8;
              }
              pmVar21 = ::std::
                        map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                        ::at(this_01,piVar35);
              prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
              pcVar3 = (pmVar21->first)._prop_part._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&prop_name,pcVar3,
                         pcVar3 + (pmVar21->first)._prop_part._M_string_length);
              pmVar22 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&variant._props,&prop_name);
              ::std::__cxx11::string::_M_assign((string *)pmVar22);
              (pmVar22->_attrib)._varying_authored = (pmVar21->second)._attrib._varying_authored;
              (pmVar22->_attrib)._variability = (pmVar21->second)._attrib._variability;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar22->_attrib)._type_name);
              linb::any::operator=
                        ((any *)&(pmVar22->_attrib)._var,(any *)&(pmVar21->second)._attrib._var);
              (pmVar22->_attrib)._var._blocked = (pmVar21->second)._attrib._var._blocked;
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar22->_attrib)._var._ts,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&(pmVar21->second)._attrib._var._ts);
              (pmVar22->_attrib)._var._ts._dirty = (pmVar21->second)._attrib._var._ts._dirty;
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar22->_attrib)._paths,&(pmVar21->second)._attrib._paths);
              AttrMetas::operator=(&(pmVar22->_attrib)._metas,&(pmVar21->second)._attrib._metas);
              TVar4 = (pmVar21->second)._type;
              pmVar22->_listOpQual = (pmVar21->second)._listOpQual;
              pmVar22->_type = TVar4;
              (pmVar22->_rel).type = (pmVar21->second)._rel.type;
              Path::operator=(&(pmVar22->_rel).targetPath,&(pmVar21->second)._rel.targetPath);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        (&(pmVar22->_rel).targetPathVector,&(pmVar21->second)._rel.targetPathVector)
              ;
              (pmVar22->_rel).listOpQual = (pmVar21->second)._rel.listOpQual;
              AttrMetas::operator=(&(pmVar22->_rel)._metas,&(pmVar21->second)._rel._metas);
              (pmVar22->_rel)._varying_authored = (pmVar21->second)._rel._varying_authored;
              ::std::__cxx11::string::_M_assign((string *)&pmVar22->_prop_value_type_name);
              pmVar22->_has_custom = (pmVar21->second)._has_custom;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
                operator_delete(prop_name._M_dataplus._M_p,
                                prop_name.field_2._M_allocated_capacity + 1);
              }
              piVar35 = piVar35 + 1;
            } while ((_Rb_tree_header *)piVar35 != local_d58);
          }
          pmVar17 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                    ::operator[](&local_d38->_variantSets,&variantSetName);
          if ((pmVar17->name)._M_string_length == 0) {
            ::std::__cxx11::string::_M_assign((string *)pmVar17);
          }
          pmVar18 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    ::operator[](&pmVar17->variantSet,&__str);
          bVar6 = true;
          if (pmVar18 != &variant) {
            PrimSpec::CopyFrom(pmVar18,&variant);
          }
LAB_0018f0c8:
          PrimSpec::~PrimSpec(&variant);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
            operator_delete(variantSetName._M_dataplus._M_p,
                            variantSetName.field_2._M_allocated_capacity + 1);
          }
          lVar9 = -0x40;
          paVar36 = &toks._M_elems[1].field_2;
          do {
            plVar14 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(paVar36 + -1))->_M_dataplus)._M_p;
            if (paVar36 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar14) {
              operator_delete(plVar14,paVar36->_M_allocated_capacity + 1);
            }
            paVar36 = paVar36 + -2;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0);
          if (!bVar6) {
LAB_0018f154:
            bVar6 = false;
            goto LAB_0018f15e;
          }
          goto LAB_0018db58;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&variant);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&variant,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&variant,"ReconstructPrimSpecRecursively",0x1e);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"():",3);
        poVar7 = (ostream *)::std::ostream::operator<<(&variant,0xe20);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        pcVar31 = "Corrupted Crate. VariantAttribute is not the child of VariantPrim.";
        lVar9 = 0x42;
LAB_0018e802:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,pcVar31,lVar9);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&variant,"\n",1);
        ::std::__cxx11::stringbuf::str();
LAB_0018e839:
        PushError(this_04,&prop_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
LAB_0018e27e:
          operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&variant);
      ::std::ios_base::~ios_base
                ((ios_base *)&variant._props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
    }
LAB_0018e2af:
    bVar6 = false;
LAB_0018f15e:
    if (primspec.has_value_ != true) {
      return bVar6;
    }
    PrimSpec::~PrimSpec((PrimSpec *)&primspec.contained);
    return bVar6;
  }
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&primspec);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"[error]",7);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&primspec,
             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
             ,0x55);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,":",1);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&primspec,"ReconstructPrimSpecRecursively",0x1e);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&primspec,"():",3);
  poVar7 = (ostream *)::std::ostream::operator<<(&primspec,0xdd9);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  __val = -current_local;
  if (0 < current_local) {
    __val = current_local;
  }
  __len = 1;
  if (9 < __val) {
    uVar34 = (ulong)__val;
    uVar33 = 4;
    do {
      __len = uVar33;
      uVar23 = (uint)uVar34;
      if (uVar23 < 100) {
        __len = __len - 2;
        goto LAB_0018dd01;
      }
      if (uVar23 < 1000) {
        __len = __len - 1;
        goto LAB_0018dd01;
      }
      if (uVar23 < 10000) goto LAB_0018dd01;
      uVar34 = uVar34 / 10000;
      uVar33 = __len + 4;
    } while (99999 < uVar23);
    __len = __len + 1;
  }
LAB_0018dd01:
  uVar33 = (uint)current_local >> 0x1f;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)(current_local >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p + uVar33,__len,__val);
  plVar14 = (long *)::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x39c41e);
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    variantSetName.field_2._M_allocated_capacity = *psVar24;
    variantSetName.field_2._8_8_ = plVar14[3];
    variantSetName._M_dataplus._M_p = (pointer)&variantSetName.field_2;
  }
  else {
    variantSetName.field_2._M_allocated_capacity = *psVar24;
    variantSetName._M_dataplus._M_p = (pointer)*plVar14;
  }
  variantSetName._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)::std::__cxx11::string::append((char *)&variantSetName);
  paVar36 = &toks._M_elems[0].field_2;
  psVar24 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar24) {
    toks._M_elems[0].field_2._M_allocated_capacity = *psVar24;
    toks._M_elems[0].field_2._8_8_ = plVar14[3];
    toks._M_elems[0]._M_dataplus._M_p = (pointer)paVar36;
  }
  else {
    toks._M_elems[0].field_2._M_allocated_capacity = *psVar24;
    toks._M_elems[0]._M_dataplus._M_p = (pointer)*plVar14;
  }
  toks._M_elems[0]._M_string_length = plVar14[1];
  *plVar14 = (long)psVar24;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar34 = ((long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nodes).
                  super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1041041041041041;
  cVar30 = '\x01';
  if (9 < uVar34) {
    uVar25 = uVar34;
    cVar5 = '\x04';
    do {
      cVar30 = cVar5;
      if (uVar25 < 100) {
        cVar30 = cVar30 + -2;
        goto LAB_0018de72;
      }
      if (uVar25 < 1000) {
        cVar30 = cVar30 + -1;
        goto LAB_0018de72;
      }
      if (uVar25 < 10000) goto LAB_0018de72;
      bVar6 = 99999 < uVar25;
      uVar25 = uVar25 / 10000;
      cVar5 = cVar30 + '\x04';
    } while (bVar6);
    cVar30 = cVar30 + '\x01';
  }
LAB_0018de72:
  paVar1 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar30);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar34);
  uVar34 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
           toks._M_elems[0]._M_string_length;
  uVar32 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toks._M_elems[0]._M_dataplus._M_p != paVar36) {
    uVar32 = toks._M_elems[0].field_2._M_allocated_capacity;
  }
  if ((ulong)uVar32 < uVar34) {
    uVar32 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar1) {
      uVar32 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 < uVar34) goto LAB_0018dee7;
    puVar15 = (undefined8 *)
              ::std::__cxx11::string::replace
                        ((ulong)&__str_1,0,(char *)0x0,(ulong)toks._M_elems[0]._M_dataplus._M_p);
  }
  else {
LAB_0018dee7:
    puVar15 = (undefined8 *)
              ::std::__cxx11::string::_M_append((char *)&toks,(ulong)__str_1._M_dataplus._M_p);
  }
  prop_name._M_dataplus._M_p = (pointer)&prop_name.field_2;
  psVar24 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar24) {
    prop_name.field_2._M_allocated_capacity = *psVar24;
    prop_name.field_2._8_8_ = puVar15[3];
  }
  else {
    prop_name.field_2._M_allocated_capacity = *psVar24;
    prop_name._M_dataplus._M_p = (pointer)*puVar15;
  }
  prop_name._M_string_length = puVar15[1];
  *puVar15 = psVar24;
  puVar15[1] = 0;
  *(char *)psVar24 = '\0';
  plVar14 = (long *)::std::__cxx11::string::append((char *)&prop_name);
  psVar24 = &variant._typeName._M_string_length;
  psVar26 = (size_type *)(plVar14 + 2);
  if ((size_type *)*plVar14 == psVar26) {
    variant._typeName._M_string_length = *psVar26;
    variant._typeName.field_2._M_allocated_capacity = plVar14[3];
    variant._0_8_ = psVar24;
  }
  else {
    variant._typeName._M_string_length = *psVar26;
    variant._0_8_ = (size_type *)*plVar14;
  }
  variant._typeName._M_dataplus._M_p = (pointer)plVar14[1];
  *plVar14 = (long)psVar26;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  poVar7 = ::std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&primspec,(char *)variant._0_8_,
                      (long)variant._typeName._M_dataplus._M_p);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  if ((size_type *)variant._0_8_ != psVar24) {
    operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop_name._M_dataplus._M_p != &prop_name.field_2) {
    operator_delete(prop_name._M_dataplus._M_p,prop_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar1) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)toks._M_elems[0]._M_dataplus._M_p != paVar36) {
    operator_delete(toks._M_elems[0]._M_dataplus._M_p,
                    toks._M_elems[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)variantSetName._M_dataplus._M_p != &variantSetName.field_2) {
    operator_delete(variantSetName._M_dataplus._M_p,variantSetName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
LAB_0018e092:
  ::std::__cxx11::stringbuf::str();
  PushError(this,(string *)&variant);
  if ((size_type *)variant._0_8_ != &variant._typeName._M_string_length) {
    operator_delete((void *)variant._0_8_,variant._typeName._M_string_length + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primspec);
  ::std::ios_base::~ios_base((ios_base *)((long)&primspec.contained + 0x68));
  return false;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecRecursively(
    int parent, int current, PrimSpec *parentPrimSpec, int level,
    const PathIndexToSpecIndexMap &psmap, Layer *layer) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "PrimSpec hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  // TODO: Refactor

  // null : parent node is Property or other Spec type.
  // non-null : parent node is PrimSpec
  PrimSpec *currPrimSpecPtr = nullptr;
  nonstd::optional<PrimSpec> primspec;

  // Assume parent node is already processed.
  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimSpecNode(parent, current, level, is_parent_variant, psmap,
                           layer, &primspec)) {
    return false;
  }

  if (primspec) {
    currPrimSpecPtr = &(primspec.value());
  }

  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimSpecRecursively(current, int(node.GetChildren()[i]),
                                      currPrimSpecPtr, level + 1, psmap, layer)) {
        return false;
      }
      DCOUT("DONE Reconstuct PrimSpec children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrimSpec) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrimSpec should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    PrimSpec variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.props()[prop_name] = std::get<1>(pp);
    }

    VariantSetSpec &vs = parentPrimSpec->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!primspec) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant PrimSpec ", primspec->name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrimSpecs.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const PrimSpec &vp = _variantPrimSpecs.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSetSpec &vs = primspec->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].children() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (primspec) {
      layer->primspecs()[primspec.value().name()] = std::move(primspec.value());
    }
  } else {
    if (_variantPrimSpecs.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!primspec) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        PrimSpec &vps = _variantPrimSpecs.at(parent);
        vps.children().emplace_back(std::move(primspec.value()));
      }
    } else if (primspec && parentPrimSpec) {
      // Add to parent prim.
      parentPrimSpec->children().emplace_back(std::move(primspec.value()));
    }
  }

  return true;
}